

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O2

bool benchmark::ParseInt32(string *src_text,char *str,int32_t *value)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  char *end;
  
  end = (char *)0x0;
  lVar1 = strtol(str,&end,10);
  if (*end == '\0') {
    if ((int)lVar1 == lVar1) {
      *value = (int)lVar1;
      return true;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)src_text);
    poVar2 = std::operator<<(poVar2," is expected to be a 32-bit integer, ");
    poVar2 = std::operator<<(poVar2,"but actually has value \"");
    poVar2 = std::operator<<(poVar2,str);
    poVar2 = std::operator<<(poVar2,"\", ");
    pcVar3 = "which overflows.\n";
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)src_text);
    poVar2 = std::operator<<(poVar2," is expected to be a 32-bit integer, ");
    poVar2 = std::operator<<(poVar2,"but actually has value \"");
    poVar2 = std::operator<<(poVar2,str);
    pcVar3 = "\".\n";
  }
  std::operator<<(poVar2,pcVar3);
  return false;
}

Assistant:

bool ParseInt32(const std::string& src_text, const char* str, int32_t* value) {
  // Parses the environment variable as a decimal integer.
  char* end = nullptr;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    std::cerr << src_text << " is expected to be a 32-bit integer, "
              << "but actually has value \"" << str << "\".\n";
    return false;
  }

  // Is the parsed value in the range of an Int32?
  const int32_t result = static_cast<int32_t>(long_value);
  if (long_value == std::numeric_limits<long>::max() ||
      long_value == std::numeric_limits<long>::min() ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
          // The parsed value overflows as an Int32.
      ) {
    std::cerr << src_text << " is expected to be a 32-bit integer, "
              << "but actually has value \"" << str << "\", "
              << "which overflows.\n";
    return false;
  }

  *value = result;
  return true;
}